

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfCut.c
# Opt level: O3

Cnf_Cut_t * Cnf_CutCreate(Cnf_Man_t *p,Aig_Obj_t *pObj)

{
  undefined2 uVar1;
  uint uVar2;
  void *pvVar3;
  Cnf_Cut_t *pCVar4;
  ulong uVar5;
  long lVar6;
  
  uVar5 = *(ulong *)&pObj->field_0x18;
  if (((uint)uVar5 & 7) - 7 < 0xfffffffe) {
    __assert_fail("Aig_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfCut.c"
                  ,0x5c,"Cnf_Cut_t *Cnf_CutCreate(Cnf_Man_t *, Aig_Obj_t *)");
  }
  if (uVar5 >> 0x38 != 0) {
    pvVar3 = (pObj->field_5).pData;
    lVar6 = 0;
    do {
      uVar2 = *(uint *)((long)pvVar3 + lVar6 + 4);
      if ((~uVar2 & 0x18000000) == 0) {
        if (uVar2 < 0xa0000000) {
          pCVar4 = (Cnf_Cut_t *)Aig_MmFlexEntryFetch(p->pMemCuts,(uVar2 >> 0x1d) * 4 + 0x1c);
          pCVar4->nFanins = (byte)(uVar2 >> 0x1d);
          pCVar4->nWords = 1;
          pCVar4->vIsop[0] = (Vec_Int_t *)0x0;
          pCVar4->vIsop[1] = (Vec_Int_t *)0x0;
          memcpy(pCVar4 + 1,(void *)((long)pvVar3 + lVar6 + 8),
                 (ulong)(*(uint *)((long)pvVar3 + lVar6 + 4) >> 0x1b & 0xfffffffc));
          uVar1 = *(undefined2 *)((long)pvVar3 + lVar6 + 4);
          *(uint *)((long)pCVar4[1].vIsop + ((ulong)((uVar2 >> 0x1d) << 2) - 8)) =
               CONCAT22(uVar1,uVar1);
          uVar5 = (ulong)*(ushort *)((long)pvVar3 + lVar6 + 4);
          pCVar4->Cost = p->pSopSizes[uVar5 ^ 0xffff] + p->pSopSizes[uVar5];
          return pCVar4;
        }
        __assert_fail("pCutBest->nLeaves <= 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfCut.c"
                      ,0x5f,"Cnf_Cut_t *Cnf_CutCreate(Cnf_Man_t *, Aig_Obj_t *)");
      }
      lVar6 = lVar6 + 0x18;
    } while ((uint)(byte)(uVar5 >> 0x38) * 0x18 != (int)lVar6);
  }
  __assert_fail("pCutBest != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfCut.c"
                ,0x5e,"Cnf_Cut_t *Cnf_CutCreate(Cnf_Man_t *, Aig_Obj_t *)");
}

Assistant:

Cnf_Cut_t * Cnf_CutCreate( Cnf_Man_t * p, Aig_Obj_t * pObj )
{
    Dar_Cut_t * pCutBest;
    Cnf_Cut_t * pCut;
    unsigned * pTruth;
    assert( Aig_ObjIsNode(pObj) );
    pCutBest = Dar_ObjBestCut( pObj );
    assert( pCutBest != NULL );
    assert( pCutBest->nLeaves <= 4 );
    pCut = Cnf_CutAlloc( p, pCutBest->nLeaves );
    memcpy( pCut->pFanins, pCutBest->pLeaves, sizeof(int) * pCutBest->nLeaves );
    pTruth = Cnf_CutTruth(pCut);
    *pTruth = (pCutBest->uTruth << 16) | pCutBest->uTruth;
    pCut->Cost = Cnf_CutSopCost( p, pCutBest );
    return pCut;
}